

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlCtxtPushInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr value)

{
  uint uVar1;
  uint uVar2;
  xmlParserInputPtr *ppxVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar6 = -1;
  if (value == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  iVar5 = ctxt->inputNr;
  uVar1 = ctxt->inputMax;
  if (iVar5 < (int)uVar1) {
LAB_001327ed:
    if ((iVar5 == 0) && (value->filename != (char *)0x0)) {
      pcVar4 = xmlParserGetDirectory(value->filename);
      if (pcVar4 == (char *)0x0) goto LAB_00132881;
    }
    else {
      pcVar4 = (char *)0x0;
    }
    iVar5 = ctxt->input_id;
    if (iVar5 == 0x7fffffff) {
      xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Input ID overflow\n");
    }
    else {
      iVar6 = ctxt->inputNr;
      ctxt->inputTab[iVar6] = value;
      ctxt->input = value;
      if ((long)iVar6 == 0) {
        (*xmlFree)(ctxt->directory);
        ctxt->directory = pcVar4;
        iVar5 = ctxt->input_id;
        iVar6 = ctxt->inputNr;
      }
      ctxt->input_id = iVar5 + 1;
      value->id = iVar5;
      ctxt->inputNr = iVar6 + 1;
    }
  }
  else {
    uVar2 = 0x28;
    if ((ctxt->options & 0x80000) == 0) {
      uVar2 = 0x14;
    }
    if ((int)uVar1 < 1) {
      uVar8 = 5;
    }
    else {
      if (uVar2 <= uVar1) {
        xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum entity nesting depth exceeded");
        xmlHaltParser(ctxt);
        return -1;
      }
      uVar7 = uVar1 + 1 >> 1;
      uVar8 = uVar7 + uVar1;
      if (uVar2 - uVar7 < uVar1) {
        uVar8 = uVar2;
      }
    }
    ppxVar3 = (xmlParserInputPtr *)(*xmlRealloc)(ctxt->inputTab,(ulong)uVar8 << 3);
    if (ppxVar3 != (xmlParserInputPtr *)0x0) {
      ctxt->inputTab = ppxVar3;
      ctxt->inputMax = uVar8;
      iVar5 = ctxt->inputNr;
      goto LAB_001327ed;
    }
LAB_00132881:
    xmlCtxtErrMemory(ctxt);
  }
  return iVar6;
}

Assistant:

int
xmlCtxtPushInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr value)
{
    char *directory = NULL;
    int maxDepth;

    if ((ctxt == NULL) || (value == NULL))
        return(-1);

    maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;

    if (ctxt->inputNr >= ctxt->inputMax) {
        xmlParserInputPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->inputMax, sizeof(tmp[0]),
                                  5, maxDepth);
        if (newSize < 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                           "Maximum entity nesting depth exceeded");
            xmlHaltParser(ctxt);
            return(-1);
        }
        tmp = xmlRealloc(ctxt->inputTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        ctxt->inputTab = tmp;
        ctxt->inputMax = newSize;
    }

    if ((ctxt->inputNr == 0) && (value->filename != NULL)) {
        directory = xmlParserGetDirectory(value->filename);
        if (directory == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
    }

    if (ctxt->input_id >= INT_MAX) {
        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT, "Input ID overflow\n");
        return(-1);
    }

    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;

    if (ctxt->inputNr == 0) {
        xmlFree(ctxt->directory);
        ctxt->directory = directory;
    }

    /*
     * Internally, the input ID is only used to detect parameter entity
     * boundaries. But there are entity loaders in downstream code that
     * detect the main document by checking for "input_id == 1".
     */
    value->id = ctxt->input_id++;

    return(ctxt->inputNr++);
}